

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O0

bool __thiscall FDiskFile::Open(FDiskFile *this,bool quiet)

{
  FileReader *pFVar1;
  DWORD entryCount_00;
  DWORD DVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong *puVar7;
  DiskEntry *__s;
  size_t sVar8;
  FUncompressedLump *pFVar9;
  FUncompressedLump *local_100;
  char *lumpName;
  DiskEntry *entry_1;
  FUncompressedLump *lump;
  DWORD i_1;
  char *extension;
  undefined1 local_84 [8];
  DiskEntry entry;
  DWORD i;
  DiskEntryList entries;
  DWORD dataOffest;
  DWORD entryCount;
  bool quiet_local;
  FDiskFile *this_local;
  
  entryCount_00 =
       anon_unknown.dwarf_6acace::GetEntryCount
                 ((this->super_FUncompressedFile).super_FResourceFile.Reader);
  DVar2 = anon_unknown.dwarf_6acace::GetDataOffset(entryCount_00);
  TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry>::TArray
            ((TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry> *)
             &entry.size);
  for (entry.offset = 0; entry.offset < entryCount_00; entry.offset = entry.offset + 1) {
    pFVar1 = (this->super_FUncompressedFile).super_FResourceFile.Reader;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,local_84,0x48);
    uVar3 = BigLong(entry.name._56_4_);
    entry.name._56_4_ = uVar3 + DVar2;
    entry.name._60_4_ = BigLong(entry.name._60_4_);
    pcVar5 = strrchr(local_84,0x2e);
    if (pcVar5 != (char *)0x0) {
      iVar4 = strcasecmp(pcVar5,".wad");
      if (iVar4 == 0) {
        TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry>::Push
                  ((TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry> *)
                   &entry.size,(DiskEntry *)local_84);
      }
    }
  }
  uVar3 = TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry>::Size
                    ((TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry> *)
                     &entry.size);
  (this->super_FUncompressedFile).super_FResourceFile.NumLumps = uVar3;
  if ((this->super_FUncompressedFile).super_FResourceFile.NumLumps == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar6 = (ulong)(this->super_FUncompressedFile).super_FResourceFile.NumLumps;
    puVar7 = (ulong *)operator_new__(uVar6 * 0x50 + 8);
    *puVar7 = uVar6;
    pFVar9 = (FUncompressedLump *)(puVar7 + 1);
    if (uVar6 != 0) {
      local_100 = pFVar9;
      do {
        FUncompressedLump::FUncompressedLump(local_100);
        local_100 = local_100 + 1;
      } while (local_100 != pFVar9 + uVar6);
    }
    (this->super_FUncompressedFile).Lumps = pFVar9;
    for (lump._0_4_ = 0; (uint)lump < (this->super_FUncompressedFile).super_FResourceFile.NumLumps;
        lump._0_4_ = (uint)lump + 1) {
      pFVar9 = (this->super_FUncompressedFile).Lumps;
      __s = TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry>::operator[]
                      ((TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry> *
                       )&entry.size,(ulong)(uint)lump);
      sVar8 = strlen(__s->name);
      pcVar5 = (char *)operator_new__(sVar8 + 1);
      strcpy(pcVar5,__s->name);
      pFVar9[(uint)lump].super_FResourceLump.Owner = (FResourceFile *)this;
      *(DWORD *)&pFVar9[(uint)lump].super_FResourceLump.field_0x4c = __s->offset;
      pFVar9[(uint)lump].super_FResourceLump.LumpSize = __s->size;
      pFVar9[(uint)lump].super_FResourceLump.Flags = '\x04';
      FString::operator=(&pFVar9[(uint)lump].super_FResourceLump.FullName,pcVar5);
    }
    if (!quiet) {
      Printf(", %d lumps\n",(ulong)(this->super_FUncompressedFile).super_FResourceFile.NumLumps);
    }
    this_local._7_1_ = true;
  }
  TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry>::~TArray
            ((TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry> *)
             &entry.size);
  return this_local._7_1_;
}

Assistant:

bool FDiskFile::Open(bool quiet)
{
	const DWORD entryCount = GetEntryCount(Reader);
	const DWORD dataOffest = GetDataOffset(entryCount);

	DiskEntryList entries;

	for (DWORD i = 0; i < entryCount; ++i)
	{
		DiskEntry entry;
		Reader->Read(&entry, sizeof entry);

		entry.offset = BigLong(entry.offset) + dataOffest;
		entry.size   = BigLong(entry.size);

		const char* const extension = strrchr(entry.name, '.');

		if (NULL != extension && 0 == stricmp(extension, ".wad"))
		{
			entries.Push(entry);
		}
	}

	NumLumps = entries.Size();

	if (0 == NumLumps)
	{
		return false;
	}

	Lumps = new FUncompressedLump[NumLumps];

	for (DWORD i = 0; i < NumLumps; ++i)
	{
		FUncompressedLump& lump = Lumps[i];
		const DiskEntry& entry = entries[i];

		char* const lumpName = new char[strlen(entry.name) + 1];
		strcpy(lumpName, entry.name);

		lump.Owner     = this;
		lump.Position  = entry.offset;
		lump.LumpSize  = entry.size;
		lump.Flags     = LUMPF_EMBEDDED;
		lump.FullName  = lumpName;
	}

	if (!quiet)
	{
		Printf(", %d lumps\n", NumLumps);
	}

	return true;
}